

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O2

void __thiscall Shell::EqualityProxy::addCongruenceAxioms(EqualityProxy *this,UnitList **units)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  Symbol *pSVar4;
  OperatorType *pOVar5;
  TermList arg0;
  TermList arg1;
  Literal *pLVar6;
  Clause *pCVar7;
  TermList *result;
  ulong uVar8;
  TermList srt;
  LiteralStack local_98;
  Stack<Kernel::TermList> local_78;
  Stack<Kernel::TermList> local_58;
  
  local_58._cursor = (TermList *)0x0;
  local_58._end = (TermList *)0x0;
  local_58._capacity = 0;
  local_58._stack = (TermList *)0x0;
  local_78._cursor = (TermList *)0x0;
  local_78._end = (TermList *)0x0;
  local_78._capacity = 0;
  local_78._stack = (TermList *)0x0;
  local_98._cursor = (Literal **)0x0;
  local_98._end = (Literal **)0x0;
  local_98._capacity = 0;
  local_98._stack = (Literal **)0x0;
  srt._content = 2;
  lVar2 = *(long *)(DAT_00a14190 + 0x68);
  lVar3 = *(long *)(DAT_00a14190 + 0x60);
  for (uVar8 = 0; ((ulong)(lVar2 - lVar3) >> 3 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
    pSVar4 = *(Symbol **)(*(long *)(DAT_00a14190 + 0x60) + uVar8 * 8);
    if ((pSVar4->_usageCount != 0) && ((pSVar4->field_0x42 & 4) == 0)) {
      uVar1 = pSVar4->_arity;
      pOVar5 = Kernel::Signature::Symbol::fnType(pSVar4);
      if (uVar1 != 0) {
        getArgumentEqualityLiterals(this,uVar1,&local_98,&local_58,&local_78,pOVar5);
        arg0._content = (uint64_t)Kernel::Term::create((uint)uVar8,uVar1,local_58._stack);
        arg1._content = (uint64_t)Kernel::Term::create((uint)uVar8,uVar1,local_78._stack);
        Kernel::SortHelper::tryGetResultSort((SortHelper *)arg0._content,(Term *)&srt,result);
        pLVar6 = makeProxyLiteral(this,true,arg0,arg1,srt);
        Lib::Stack<Kernel::Literal_*>::push(&local_98,pLVar6);
        pCVar7 = createEqProxyAxiom(this,&local_98);
        Lib::List<Kernel::Unit_*>::push(&pCVar7->super_Unit,units);
      }
    }
  }
  lVar2 = *(long *)(DAT_00a14190 + 0x88);
  lVar3 = *(long *)(DAT_00a14190 + 0x80);
  for (uVar8 = 1; uVar8 < ((ulong)(lVar2 - lVar3) >> 3 & 0xffffffff); uVar8 = uVar8 + 1) {
    pSVar4 = *(Symbol **)(*(long *)(DAT_00a14190 + 0x80) + uVar8 * 8);
    if (((pSVar4->_usageCount != 0) && ((pSVar4->field_0x42 & 4) == 0)) &&
       (uVar1 = pSVar4->_arity, uVar1 != 0)) {
      pOVar5 = Kernel::Signature::Symbol::predType(pSVar4);
      getArgumentEqualityLiterals(this,uVar1,&local_98,&local_58,&local_78,pOVar5);
      pLVar6 = Kernel::Literal::create((uint)uVar8,uVar1,false,local_58._stack);
      Lib::Stack<Kernel::Literal_*>::push(&local_98,pLVar6);
      pLVar6 = Kernel::Literal::create((uint)uVar8,uVar1,true,local_78._stack);
      Lib::Stack<Kernel::Literal_*>::push(&local_98,pLVar6);
      pCVar7 = createEqProxyAxiom(this,&local_98);
      Lib::List<Kernel::Unit_*>::push(&pCVar7->super_Unit,units);
    }
  }
  Lib::Stack<Kernel::Literal_*>::~Stack(&local_98);
  Lib::Stack<Kernel::TermList>::~Stack(&local_78);
  Lib::Stack<Kernel::TermList>::~Stack(&local_58);
  return;
}

Assistant:

void EqualityProxy::addCongruenceAxioms(UnitList*& units)
{
  // This is Krystof Hoder's comment:
  // TODO: skip UPDR predicates!!!
  Stack<TermList> vars1;
  Stack<TermList> vars2;
  LiteralStack lits;
  TermList srt;

  unsigned funs = env.signature->functions();
  for (unsigned i=0; i<funs; i++) {
    Signature::Symbol* fnSym = env.signature->getFunction(i);
    // can axiomatise equality _before_ preprocessing, so skip (some) introduced symbols
    if(!fnSym->usageCnt() || fnSym->skipCongruence())
      continue;
    unsigned arity = fnSym->arity();
    OperatorType* fnType = fnSym->fnType();
    if (arity == 0) {
      continue;
    }
    getArgumentEqualityLiterals(arity, lits, vars1, vars2, fnType);
    Term* t1 = Term::create(i, arity, vars1.begin());
    Term* t2 = Term::create(i, arity, vars2.begin());
    SortHelper::tryGetResultSort(t1, srt);
    lits.push(makeProxyLiteral(true, TermList(t1), TermList(t2), srt));

    Clause* cl = createEqProxyAxiom(lits);
    UnitList::push(cl,units);
  }

  unsigned preds = env.signature->predicates();
  for (unsigned i = 1; i < preds; i++) {
    Signature::Symbol* predSym = env.signature->getPredicate(i);
    // can axiomatise equality _before_ preprocessing, so skip (some) introduced symbols
    if(!predSym->usageCnt() || predSym->skipCongruence())
      continue;
    unsigned arity = predSym->arity();
    if (arity == 0) {
      continue;
    }
    getArgumentEqualityLiterals(arity, lits, vars1, vars2, predSym->predType());
    lits.push(Literal::create(i, arity, false, vars1.begin()));
    lits.push(Literal::create(i, arity, true, vars2.begin()));

    Clause* cl = createEqProxyAxiom(lits);
    UnitList::push(cl,units);
  }
}